

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

void __thiscall hwnet::TCPSocket::recvInWorker(TCPSocket *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  mutex *__mutex;
  list<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_> *this_00;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  int *piVar7;
  rep rVar8;
  undefined1 auStack_98 [8];
  RecvCallback recvCallback;
  shared_ptr<hwnet::TCPSocket> self;
  ErrorCallback errorCallback;
  undefined1 local_40 [8];
  value_type front;
  
  self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  recvCallback.super__Function_base._M_functor._8_8_ = 0;
  recvCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  auStack_98 = (undefined1  [8])0x0;
  recvCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::TCPSocket,void>
            ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&recvCallback._M_invoker,
             (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<hwnet::TCPSocket>);
  __mutex = &this->mtx;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  std::
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
  ::operator=((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
               *)auStack_98,&this->recvCallback_);
  this_00 = &this->recvList;
  p_Var2 = (this->recvList).
           super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (((this->readable & p_Var2 != (_List_node_base *)this_00) == 0) && (this->socketError == false)
     ) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    if (this->socketError == true) {
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator=
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                 &self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &this->errorCallback_);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else {
      local_40 = (undefined1  [8])p_Var2[1]._M_next;
      front.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var2[1]._M_prev;
      if (front.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &((front.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var1 = &((front.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        }
      }
      std::__cxx11::
      list<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>::
      _M_erase(this_00,(this->recvList).
                       super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next);
      iVar4 = this->readableVer;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      do {
        sVar6 = read(this->fd,(void *)((long)&((_List_node_base *)
                                              (((Ptr *)local_40)->
                                              super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr)->_M_next->_M_next +
                                      *(size_t *)((long)local_40 + 0x10)),
                     *(size_t *)((long)local_40 + 0x18));
        if (sVar6 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      if (0 < (int)sVar6) {
        if (recvCallback.super__Function_base._M_functor._8_8_ != 0) {
          (*recvCallback.super__Function_base._M_manager)
                    ((_Any_data *)auStack_98,(_Any_data *)&recvCallback._M_invoker,
                     (_Manager_operation)local_40);
        }
        iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar5 == 0) {
          if (this->recvTimeout != 0) {
            rVar8 = std::chrono::_V2::steady_clock::now();
            (this->lastRecvTime).__d.__r = rVar8;
          }
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          if (front.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       front.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          goto LAB_001155a4;
        }
LAB_001155f9:
        std::__throw_system_error(iVar5);
      }
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar5 != 0) goto LAB_001155f9;
      if (((int)sVar6 < 0) && (piVar7 = __errno_location(), *piVar7 == 0xb)) {
        std::__cxx11::
        list<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>::
        push_front(this_00,(value_type *)local_40);
        if (iVar4 == this->readableVer) {
          this->readable = false;
        }
        bVar3 = false;
      }
      else {
        piVar7 = __errno_location();
        this->err = *piVar7;
        this->socketError = true;
        bVar3 = true;
        std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator=
                  ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                   &self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,&this->errorCallback_);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (front.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   front.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (!bVar3) goto LAB_001155a4;
    }
    Close(this);
  }
LAB_001155a4:
  if (self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (recvCallback.super__Function_base._M_functor._8_8_ != 0) {
    (*(code *)recvCallback.super__Function_base._M_functor._8_8_)(auStack_98,auStack_98,3);
  }
  return;
}

Assistant:

void TCPSocket::recvInWorker() {

	ErrorCallback errorCallback = nullptr;
	RecvCallback  recvCallback  = nullptr;
	auto getError 				= false;
	auto self 					= shared_from_this();
	this->mtx.lock();
	recvCallback = this->recvCallback_;
	
	if(!this->canRead()){
		this->mtx.unlock();
	} else {
		if(this->socketError) {
			errorCallback = this->errorCallback_;
			this->mtx.unlock();
			getError = true;
		} else {		
			auto front = recvList.front();
			recvList.pop_front();
			auto localVer = this->readableVer;
			this->mtx.unlock();

#ifdef USE_SSL
			int n = 0;
			if(this->ssl) {
				n = SSLread(this->ssl,front->BuffPtr(),front->Len());
			} else {
				n = TEMP_FAILURE_RETRY(::read(this->fd,front->BuffPtr(),front->Len()));
			}
#else
			int n = TEMP_FAILURE_RETRY(::read(this->fd,front->BuffPtr(),front->Len()));

#endif

			if(n > 0) {

				if(recvCallback){
					recvCallback(self,front,n);			
				}

				this->mtx.lock();
				if(this->recvTimeout > 0) {
					this->lastRecvTime = std::chrono::steady_clock::now();
				}
				this->mtx.unlock();

			} else {
				this->mtx.lock();
				if(n < 0 && errno == EAGAIN) {					
					recvList.push_front(front);
					if(localVer == this->readableVer) {
						this->readable = false;
					}
				} else {
					getError = true;
					this->err = errno;
					this->socketError = true;
					errorCallback = this->errorCallback_;	
				}
				this->mtx.unlock();			
			}
		}

		if(getError) {
			if(errorCallback) {
				errorCallback(self,err);
			} else {
				this->Close();
			}		
		}
	}
}